

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

void __thiscall
Js::RecyclableArrayDisplay::RecyclableArrayDisplay
          (RecyclableArrayDisplay *this,ResolvedObject *resolvedObject)

{
  RecyclableObjectDisplay::RecyclableObjectDisplay
            (&this->super_RecyclableObjectDisplay,resolvedObject,0);
  (this->super_RecyclableObjectDisplay).super_IDiagObjectModelDisplay._vptr_IDiagObjectModelDisplay
       = (_func_int **)&PTR_Name_0137f038;
  return;
}

Assistant:

RecyclableArrayDisplay::RecyclableArrayDisplay(ResolvedObject* resolvedObject)
        : RecyclableObjectDisplay(resolvedObject)
    {
    }